

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

array<char,_32UL> * highsDoubleToString(double val,double tolerance)

{
  double *pdVar1;
  pointer pvVar2;
  size_type sVar3;
  int __x;
  array<char,_32UL> *in_RDI;
  array<char,_32UL> *paVar4;
  undefined8 in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar5;
  double in_XMM1_Qa;
  double l;
  double local_38;
  double local_20;
  double local_18;
  double local_10;
  undefined8 local_8;
  
  paVar4 = in_RDI;
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  memset(in_RDI,0,0x20);
  __x = (int)paVar4;
  std::abs(__x);
  if ((extraout_XMM0_Qa != INFINITY) || (NAN(extraout_XMM0_Qa))) {
    local_38 = 1.0 - local_10;
    std::abs(__x);
    pdVar1 = std::max<double>(&local_10,&local_20);
    dVar5 = log10(*pdVar1 / local_10);
    local_38 = local_38 + dVar5;
  }
  else {
    local_38 = 1.0;
  }
  local_18 = local_38;
  switch((int)local_38) {
  case 0:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b09d);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%c",0x30);
    break;
  case 1:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b0e2);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.1g",local_8);
    break;
  case 2:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b12b);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.2g",local_8);
    break;
  case 3:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b16e);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.3g",local_8);
    break;
  case 4:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b1b1);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.4g",local_8);
    break;
  case 5:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b1f4);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.5g",local_8);
    break;
  case 6:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b237);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.6g",local_8);
    break;
  case 7:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b27a);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.7g",local_8);
    break;
  case 8:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b2bd);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.8g",local_8);
    break;
  case 9:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b300);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.9g",local_8);
    break;
  case 10:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b343);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.10g",local_8);
    break;
  case 0xb:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b386);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.11g",local_8);
    break;
  case 0xc:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b3c9);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.12g",local_8);
    break;
  case 0xd:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b40c);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.13g",local_8);
    break;
  case 0xe:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b44f);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.14g",local_8);
    break;
  case 0xf:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b48f);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.15g",local_8);
    break;
  default:
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x45b4cf);
    sVar3 = std::array<char,_32UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.16g",local_8);
  }
  return in_RDI;
}

Assistant:

std::array<char, 32> highsDoubleToString(const double val,
                                         const double tolerance) {
  decltype(highsDoubleToString(std::declval<double>(),
                               std::declval<double>())) printString = {};
  double l =
      std::abs(val) == kHighsInf
          ? 1.0
          : (1.0 - tolerance +
             std::log10(std::max(tolerance, std::abs(val)) / (tolerance)));
  switch (int(l)) {
    case 0:
      std::snprintf(printString.data(), printString.size(), "%c", '0');
      break;
    case 1:
      std::snprintf(printString.data(), printString.size(), "%.1g", val);
      break;
    case 2:
      std::snprintf(printString.data(), printString.size(), "%.2g", val);
      break;
    case 3:
      std::snprintf(printString.data(), printString.size(), "%.3g", val);
      break;
    case 4:
      std::snprintf(printString.data(), printString.size(), "%.4g", val);
      break;
    case 5:
      std::snprintf(printString.data(), printString.size(), "%.5g", val);
      break;
    case 6:
      std::snprintf(printString.data(), printString.size(), "%.6g", val);
      break;
    case 7:
      std::snprintf(printString.data(), printString.size(), "%.7g", val);
      break;
    case 8:
      std::snprintf(printString.data(), printString.size(), "%.8g", val);
      break;
    case 9:
      std::snprintf(printString.data(), printString.size(), "%.9g", val);
      break;
    case 10:
      std::snprintf(printString.data(), printString.size(), "%.10g", val);
      break;
    case 11:
      std::snprintf(printString.data(), printString.size(), "%.11g", val);
      break;
    case 12:
      std::snprintf(printString.data(), printString.size(), "%.12g", val);
      break;
    case 13:
      std::snprintf(printString.data(), printString.size(), "%.13g", val);
      break;
    case 14:
      std::snprintf(printString.data(), printString.size(), "%.14g", val);
      break;
    case 15:
      std::snprintf(printString.data(), printString.size(), "%.15g", val);
      break;
    default:
      std::snprintf(printString.data(), printString.size(), "%.16g", val);
  }

  return printString;
}